

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O1

bool __thiscall
HighsTimer::reportOnTolerance
          (HighsTimer *this,char *grep_stamp,vector<int,_std::allocator<int>_> *clock_list,
          double ideal_sum_time,double tolerance_percent_report)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  size_t in_RCX;
  undefined1 uVar5;
  int iVar6;
  pointer piVar7;
  double __n;
  long lVar8;
  pointer piVar9;
  bool bVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  double dVar12;
  double dVar13;
  vector<double,_std::allocator<double>_> percent_sum_clock_times;
  allocator_type local_81;
  char *local_80;
  double local_78;
  pointer local_70;
  pointer local_68;
  double local_60;
  double local_58;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  piVar9 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (double)((long)piVar7 - (long)piVar9 >> 2);
  local_80 = grep_stamp;
  local_78 = ideal_sum_time;
  local_50 = tolerance_percent_report;
  read(this,0,clock_list,in_RCX);
  local_60 = extraout_XMM0_Qa;
  if (piVar7 == piVar9) {
    bVar10 = true;
    dVar11 = 0.0;
  }
  else {
    iVar6 = 0;
    dVar11 = 0.0;
    lVar8 = 0;
    local_70 = piVar7;
    local_68 = piVar9;
    local_58 = __n;
    do {
      uVar1 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if ((this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar1] <= 0.0) {
        printf("Clock %d - %s - still running\n",(ulong)uVar1,
               (this->clock_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar1]._M_dataplus._M_p);
      }
      iVar6 = iVar6 + (this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar1];
      dVar11 = dVar11 + (this->clock_time).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
      lVar8 = lVar8 + 1;
    } while ((long)__n + (ulong)(__n == 0.0) != lVar8);
    bVar10 = iVar6 == 0;
    piVar7 = local_70;
    __n = local_58;
    piVar9 = local_68;
  }
  uVar5 = 0;
  if ((!bVar10) && (0.0 <= dVar11)) {
    std::vector<double,_std::allocator<double>_>::vector(&local_48,(size_type)__n,&local_81);
    dVar13 = 0.0;
    if (piVar7 != piVar9) {
      piVar3 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        dVar12 = (pdVar4[piVar3[lVar8]] * 100.0) / dVar11;
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar8] = dVar12;
        if (dVar13 <= dVar12) {
          dVar13 = dVar12;
        }
        lVar8 = lVar8 + 1;
      } while ((long)__n + (ulong)(__n == 0.0) != lVar8);
    }
    uVar5 = local_50 <= dVar13;
    if (local_50 <= dVar13) {
      local_70 = (pointer)CONCAT44(local_70._4_4_,(uint)(local_50 <= dVar13));
      printf("\n%s-time  Operation                       :    Time     ( Total",local_80);
      if (0.0 < local_78) {
        printf(";  Ideal");
      }
      puts(";  Local):    Calls  Time/Call");
      dVar11 = 0.0;
      if (piVar7 != piVar9) {
        lVar8 = 0;
        do {
          iVar6 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
          dVar13 = (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar6];
          iVar2 = (this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar6];
          if ((0 < iVar2) &&
             ((local_50 <= 0.0 ||
              (local_50 <=
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8])))) {
            local_68 = (pointer)(dVar13 * 100.0);
            local_58 = dVar11;
            printf("%s-time  %-32s: %11.4e (%5.1f%%",dVar13,(dVar13 * 100.0) / local_60,local_80,
                   (this->clock_names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar6]._M_dataplus._M_p);
            if (0.0 < local_78) {
              printf("; %5.1f%%",(double)local_68 / local_78);
            }
            printf("; %5.1f%%):%9ld %11.4e\n",
                   local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8],dVar13 / (double)iVar2,
                   (long)(this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar6]);
            dVar11 = local_58;
          }
          dVar11 = dVar11 + dVar13;
          lVar8 = lVar8 + 1;
        } while ((long)__n + (ulong)(__n == 0.0) != lVar8);
      }
      printf("%s-time  SUM                             : %11.4e (%5.1f%%",dVar11,
             (dVar11 * 100.0) / local_60,local_80);
      if (0.0 < local_78) {
        printf("; %5.1f%%",(dVar11 * 100.0) / local_78);
      }
      printf("; %5.1f%%)\n",0x4059000000000000);
      printf("%s-time  TOTAL                           : %11.4e\n",local_60,local_80);
      uVar5 = local_70._0_1_;
    }
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return (bool)uVar5;
}

Assistant:

bool reportOnTolerance(
      const char*
          grep_stamp,  //!< Character string used to extract output using grep
      std::vector<HighsInt>& clock_list,  //!< List of indices to report
      double ideal_sum_time = 0,          //!< Ideal value for times to sum to
      double tolerance_percent_report =
          0  //!< Lower bound on percentage of total time
             //!< before an individual clock is reported
  ) {
    size_t num_clock_list_entries = clock_list.size();
    double current_run_highs_time = read();
    bool non_null_report = false;

    // Check validity of the clock list and check no clocks are still
    // running, determine whether there are any times to report and
    // determine the total clock times
    HighsInt sum_calls = 0;
    double sum_clock_times = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      assert(iClock >= 0);
      assert(iClock < num_clock);
      // Check that the clock's not still running. It should be set to
      // getWallTime() >= 0 (or initialised to initial_clock_start > 0)
      const bool clock_stopped = clock_start[iClock] > 0;
      if (!clock_stopped) {
        printf("Clock %d - %s - still running\n", int(iClock),
               clock_names[iClock].c_str());
      }
      assert(clock_stopped);
      sum_calls += clock_num_call[iClock];
      sum_clock_times += clock_time[iClock];
    }
    if (!sum_calls) return non_null_report;
    if (sum_clock_times < 0) return non_null_report;

    std::vector<double> percent_sum_clock_times(num_clock_list_entries);
    double max_percent_sum_clock_times = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      percent_sum_clock_times[i] = 100.0 * clock_time[iClock] / sum_clock_times;
      max_percent_sum_clock_times =
          std::max(percent_sum_clock_times[i], max_percent_sum_clock_times);
    }
    if (max_percent_sum_clock_times < tolerance_percent_report)
      return non_null_report;

    non_null_report = true;

    // Report one line per clock, the time, number of calls and time per call
    printf("\n%s-time  Operation                       :    Time     ( Total",
           grep_stamp);
    if (ideal_sum_time > 0) printf(";  Ideal");
    printf(";  Local):    Calls  Time/Call\n");
    // Convert approximate seconds
    double sum_time = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      double time = clock_time[iClock];
      double percent_run_highs = 100.0 * time / current_run_highs_time;
      double time_per_call = 0;
      if (clock_num_call[iClock] > 0) {
        time_per_call = time / clock_num_call[iClock];
        const bool report_time =
            tolerance_percent_report > 0
                ? percent_sum_clock_times[i] >= tolerance_percent_report
                : clock_num_call[iClock] > 0;
        if (report_time) {
          printf("%s-time  %-32s: %11.4e (%5.1f%%", grep_stamp,
                 clock_names[iClock].c_str(), time, percent_run_highs);
          if (ideal_sum_time > 0) {
            double percent_ideal = 100.0 * time / ideal_sum_time;
            printf("; %5.1f%%", percent_ideal);
          }
          printf("; %5.1f%%):%9ld %11.4e\n", percent_sum_clock_times[i],
                 static_cast<long int>(clock_num_call[iClock]), time_per_call);
        }
      }
      sum_time += time;
    }
    double percent_sum_clock_times_all = 100.0;
    assert(sum_time == sum_clock_times);
    double percent_run_highs = 100.0 * sum_time / current_run_highs_time;
    printf("%s-time  SUM                             : %11.4e (%5.1f%%",
           grep_stamp, sum_time, percent_run_highs);
    if (ideal_sum_time > 0) {
      double percent_ideal = 100.0 * sum_time / ideal_sum_time;
      printf("; %5.1f%%", percent_ideal);
    }
    printf("; %5.1f%%)\n", percent_sum_clock_times_all);
    printf("%s-time  TOTAL                           : %11.4e\n", grep_stamp,
           current_run_highs_time);
    return non_null_report;
  }